

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_neighbor_allgatherv_
               (void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,void *recvbuf,
               int *recvcounts,int *displs,MPIABI_Fint *recvtype,MPIABI_Fint *comm,
               MPIABI_Fint *ierror)

{
  int *displs_local;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Fint *sendtype_local;
  MPIABI_Fint *sendcount_local;
  void *sendbuf_local;
  
  mpi_neighbor_allgatherv_
            (sendbuf,sendcount,sendtype,recvbuf,recvcounts,displs,recvtype,comm,ierror);
  return;
}

Assistant:

void mpiabi_neighbor_allgatherv_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_neighbor_allgatherv_(
    sendbuf,
    sendcount,
    sendtype,
    recvbuf,
    recvcounts,
    displs,
    recvtype,
    comm,
    ierror
  );
}